

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O1

uint fl_utf8toUtf16(char *src,uint srclen,unsigned_short *dst,uint dstlen)

{
  char cVar1;
  bool bVar2;
  unsigned_short uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  char *end;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  wchar_t len_1;
  wchar_t len;
  undefined8 local_38;
  
  end = src + srclen;
  local_38 = in_RAX;
  if (dstlen == 0) {
    uVar4 = 0;
  }
  else {
    uVar8 = 0;
    do {
      uVar7 = (uint)uVar8;
      if (end <= src) {
        dst[uVar8] = 0;
        return uVar7;
      }
      cVar1 = *src;
      if (cVar1 < '\0') {
        uVar5 = fl_utf8decode(src,end,(wchar_t *)((long)&local_38 + 4));
        uVar4 = uVar8;
        if (uVar5 < 0x10000) {
LAB_001fe97b:
          uVar3 = (unsigned_short)uVar5;
          bVar2 = true;
          uVar8 = uVar4;
        }
        else {
          uVar4 = (ulong)(uVar7 + 2);
          if (uVar7 + 2 < dstlen) {
            dst[uVar8] = (ushort)(uVar5 + 0xf0000 >> 10) & 0x3ff | 0xd800;
            uVar5 = uVar5 & 0x3ff | 0xdc00;
            uVar4 = (ulong)(uVar7 + 1);
            goto LAB_001fe97b;
          }
          uVar3 = 0;
          bVar2 = false;
        }
        uVar7 = (uint)uVar4;
        src = src + local_38._4_4_;
        dst[uVar8] = uVar3;
        if (!bVar2) goto LAB_001fe9b7;
      }
      else {
        src = src + 1;
        dst[uVar8] = (short)cVar1;
      }
      uVar5 = uVar7 + 1;
      uVar8 = (ulong)uVar5;
    } while (uVar5 != dstlen);
    dst[uVar7] = 0;
    uVar4 = (ulong)uVar5;
  }
LAB_001fe9b7:
  uVar7 = (uint)uVar4;
  while (src < end) {
    iVar6 = (int)uVar4;
    if (*src < '\0') {
      uVar7 = fl_utf8decode(src,end,(wchar_t *)&local_38);
      src = src + (wchar_t)local_38;
      iVar6 = (iVar6 + 1) - (uint)(uVar7 < 0x10000);
    }
    else {
      src = src + 1;
    }
    uVar7 = iVar6 + 1;
    uVar4 = (ulong)uVar7;
  }
  return uVar7;
}

Assistant:

unsigned fl_utf8toUtf16(const char* src, unsigned srclen,
		  unsigned short* dst, unsigned dstlen)
{
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    if (p >= e) {dst[count] = 0; return count;}
    if (!(*p & 0x80)) { /* ascii */
      dst[count] = *p++;
    } else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs < 0x10000) {
	dst[count] = ucs;
      } else {
	/* make a surrogate pair: */
	if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
	dst[count] = (((ucs-0x10000u)>>10)&0x3ff) | 0xd800;
	dst[++count] = (ucs&0x3ff) | 0xdc00;
      }
    }
    if (++count == dstlen) {dst[count-1] = 0; break;}
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    if (!(*p & 0x80)) p++;
    else {
      int len; unsigned ucs = fl_utf8decode(p,e,&len);
      p += len;
      if (ucs >= 0x10000) ++count;
    }
    ++count;
  }
  return count;
}